

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  bool bVar2;
  byte bVar3;
  ImGuiWindow *pIVar4;
  float *in_RCX;
  uint in_EDX;
  byte in_SIL;
  bool bVar5;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  ImGuiItemFlags backup_item_flags;
  bool item_add;
  float backup_clip_rect_max_x;
  float backup_clip_rect_min_x;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  bool span_all_columns;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float in_stack_ffffffffffffff20;
  float x2;
  float fVar6;
  float fVar7;
  undefined4 in_stack_ffffffffffffff30;
  float _x;
  undefined4 in_stack_ffffffffffffff34;
  float idx;
  ImVec4 *col_00;
  ImGuiWindow *in_stack_ffffffffffffff40;
  float id_00;
  ImRect *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ImU32 in_stack_ffffffffffffff54;
  byte in_stack_ffffffffffffff59;
  byte in_stack_ffffffffffffff5a;
  byte bVar8;
  uint flags_00;
  ImGuiItemFlags in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar9;
  float fVar10;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 in_stack_ffffffffffffff90;
  float local_54;
  float fStack_50;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *pIVar11;
  ImGuiContext *bb_00;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    pIVar11 = &GImGui->Style;
    col_00 = (ImVec4 *)0x0;
    bb_00 = GImGui;
    local_3c = ImGuiWindow::GetID(in_stack_ffffffffffffff40,(char *)0x0,
                                  (char *)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30));
    local_44 = CalcTextSize((char *)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
                            SUB81((ulong)col_00 >> 0x38,0),SUB84(col_00,0));
    if ((*in_RCX != 0.0) || (NAN(*in_RCX))) {
      _x = *in_RCX;
    }
    else {
      _x = local_44.x;
    }
    if ((in_RCX[1] != 0.0) || (NAN(in_RCX[1]))) {
      fVar7 = in_RCX[1];
    }
    else {
      fVar7 = local_44.y;
    }
    idx = _x;
    ImVec2::ImVec2(&local_4c,_x,fVar7);
    IVar1 = (pIVar4->DC).CursorPos;
    fVar10 = (pIVar4->DC).CurrLineTextBaseOffset;
    fStack_50 = IVar1.y;
    local_54 = IVar1.x;
    ItemSize((ImVec2 *)in_stack_ffffffffffffff40,(float)((ulong)col_00 >> 0x20));
    id_00 = (float)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    bVar5 = (in_EDX & 2) != 0;
    if (bVar5) {
      local_54 = (pIVar4->ParentWorkRect).Min.x;
      x2 = (pIVar4->ParentWorkRect).Max.x;
    }
    else {
      x2 = (pIVar4->WorkRect).Max.x;
    }
    fVar6 = local_54;
    if (((*in_RCX == 0.0) && (!NAN(*in_RCX))) || ((in_EDX & 0x800000) != 0)) {
      local_4c.x = ImMax<float>(local_44.x,x2 - local_54);
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,local_54 + local_4c.x,
                   fVar10 + fStack_50 + local_4c.y);
    ImRect::ImRect((ImRect *)CONCAT44(idx,_x),fVar7,fVar6,x2,in_stack_ffffffffffffff20);
    if ((in_EDX & 0x4000000) == 0) {
      in_stack_ffffffffffffff7c = (pIVar11->ItemSpacing).x;
      in_stack_ffffffffffffff78 = (pIVar11->ItemSpacing).y;
      in_stack_ffffffffffffff74 = (float)(int)(in_stack_ffffffffffffff7c * 0.5);
      in_stack_ffffffffffffff70 = (float)(int)(in_stack_ffffffffffffff78 * 0.5);
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 - in_stack_ffffffffffffff74;
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 - in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff88 =
           (in_stack_ffffffffffffff7c - in_stack_ffffffffffffff74) + in_stack_ffffffffffffff88;
      in_stack_ffffffffffffff8c =
           (in_stack_ffffffffffffff78 - in_stack_ffffffffffffff70) + in_stack_ffffffffffffff8c;
    }
    fVar7 = (pIVar4->ClipRect).Min.x;
    fVar10 = (pIVar4->ClipRect).Max.x;
    if (bVar5) {
      (pIVar4->ClipRect).Min.x = (pIVar4->ParentWorkRect).Min.x;
      (pIVar4->ClipRect).Max.x = (pIVar4->ParentWorkRect).Max.x;
    }
    if ((in_EDX & 8) == 0) {
      bVar2 = ItemAdd(in_stack_ffffffffffffff48,(ImGuiID)id_00,(ImRect *)col_00);
      uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff64);
    }
    else {
      in_stack_ffffffffffffff60 = (pIVar4->DC).ItemFlags;
      (pIVar4->DC).ItemFlags = (pIVar4->DC).ItemFlags | 0x14;
      bVar2 = ItemAdd(in_stack_ffffffffffffff48,(ImGuiID)id_00,(ImRect *)col_00);
      uVar9 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff64);
      (pIVar4->DC).ItemFlags = in_stack_ffffffffffffff60;
    }
    if (bVar5) {
      (pIVar4->ClipRect).Min.x = fVar7;
      (pIVar4->ClipRect).Max.x = fVar10;
    }
    if ((char)((uint)uVar9 >> 0x18) == '\0') {
      local_1 = false;
    }
    else {
      if ((bVar5) && ((pIVar4->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PushColumnsBackground();
      }
      flags_00 = 0;
      if ((in_EDX & 0x100000) != 0) {
        flags_00 = 0x20000;
      }
      if ((in_EDX & 0x200000) != 0) {
        flags_00 = flags_00 | 0x10;
      }
      if ((in_EDX & 0x400000) != 0) {
        flags_00 = flags_00 | 0x80;
      }
      if ((in_EDX & 8) != 0) {
        flags_00 = flags_00 | 0x4000;
      }
      if ((in_EDX & 4) != 0) {
        flags_00 = flags_00 | 0x120;
      }
      if ((in_EDX & 0x10) != 0) {
        flags_00 = flags_00 | 0x1000;
      }
      if ((in_EDX & 8) != 0) {
        local_11 = 0;
      }
      bVar8 = local_11;
      bVar3 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                             ,(ImGuiID)in_stack_ffffffffffffff74,(bool *)CONCAT44(fVar7,fVar10),
                             (bool *)CONCAT44(uVar9,in_stack_ffffffffffffff60),flags_00);
      if ((((bool)bVar3) || (((in_stack_ffffffffffffff5a & 1) != 0 && ((in_EDX & 0x2000000) != 0))))
         && (((bb_00->NavDisableMouseHover & 1U) == 0 &&
             ((bb_00->NavWindow == pIVar4 && (bb_00->NavLayer == (pIVar4->DC).NavLayerCurrent))))))
      {
        bb_00->NavDisableHighlight = true;
        SetNavID(local_3c,(pIVar4->DC).NavLayerCurrent,(pIVar4->DC).NavFocusScopeIdCurrent);
      }
      if ((bVar3 & 1) != 0) {
        MarkItemEdited(local_3c);
      }
      if ((in_EDX & 0x10) != 0) {
        SetItemAllowOverlap();
      }
      if (local_11 != (bVar8 & 1)) {
        (pIVar4->DC).LastItemStatusFlags = (pIVar4->DC).LastItemStatusFlags | 8;
      }
      if (((in_stack_ffffffffffffff59 & 1) != 0) && ((in_EDX & 0x1000000) != 0)) {
        in_stack_ffffffffffffff5a = 1;
      }
      if (((in_stack_ffffffffffffff5a & 1) != 0) || (local_11 != 0)) {
        in_stack_ffffffffffffff54 = GetColorU32((ImGuiCol)idx,_x);
        in_stack_ffffffffffffff48 =
             (ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
        IVar1.y = in_stack_ffffffffffffff8c;
        IVar1.x = in_stack_ffffffffffffff88;
        id_00 = in_stack_ffffffffffffff8c;
        RenderFrame(in_stack_ffffffffffffff90,IVar1,(ImU32)in_stack_ffffffffffffff84,
                    SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0),in_stack_ffffffffffffff7c);
        RenderNavHighlight((ImRect *)bb_00,(ImGuiID)((ulong)pIVar11 >> 0x20),
                           (ImGuiNavHighlightFlags)pIVar11);
      }
      if ((bVar5) && ((pIVar4->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PopColumnsBackground();
      }
      if ((in_EDX & 8) != 0) {
        PushStyleColor((ImGuiCol)id_00,col_00);
      }
      RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (ImVec2 *)CONCAT44(fVar7,fVar10),
                        (char *)CONCAT44(uVar9,in_stack_ffffffffffffff60),
                        (char *)CONCAT44(flags_00,CONCAT13(bVar8,CONCAT12(in_stack_ffffffffffffff5a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff59,bVar3)))),
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        &in_stack_ffffffffffffff48->Min,
                        (ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if ((in_EDX & 8) != 0) {
        PopStyleColor((int)x2);
      }
      if (((((bVar3 & 1) != 0) && ((pIVar4->Flags & 0x4000000U) != 0)) && ((in_EDX & 1) == 0)) &&
         (((pIVar4->DC).ItemFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
      local_1 = (bool)(bVar3 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    // We don't support (size < 0.0f) in Selectable() because the ItemSpacing extension would make explicitely right-aligned sizes not visibly match other widgets.
    const bool span_all_columns = (flags & ImGuiSelectableFlags_SpanAllColumns) != 0;
    const float min_x = span_all_columns ? window->ParentWorkRect.Min.x : pos.x;
    const float max_x = span_all_columns ? window->ParentWorkRect.Max.x : window->WorkRect.Max.x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb(min_x, pos.y, text_max.x, text_max.y);
    if ((flags & ImGuiSelectableFlags_NoPadWithHalfSpacing) == 0)
    {
        const float spacing_x = style.ItemSpacing.x;
        const float spacing_y = style.ItemSpacing.y;
        const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
        const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
        bb.Min.x -= spacing_L;
        bb.Min.y -= spacing_U;
        bb.Max.x += (spacing_x - spacing_L);
        bb.Max.y += (spacing_y - spacing_U);
    }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(0, 255, 0, 255)); }

    // Modify ClipRect for the ItemAdd(), faster than doing a PushColumnsBackground/PushTableBackground for every Selectable..
    const float backup_clip_rect_min_x = window->ClipRect.Min.x;
    const float backup_clip_rect_max_x = window->ClipRect.Max.x;
    if (span_all_columns)
    {
        window->ClipRect.Min.x = window->ParentWorkRect.Min.x;
        window->ClipRect.Max.x = window->ParentWorkRect.Max.x;
    }

    bool item_add;
    if (flags & ImGuiSelectableFlags_Disabled)
    {
        ImGuiItemFlags backup_item_flags = window->DC.ItemFlags;
        window->DC.ItemFlags |= ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNavDefaultFocus;
        item_add = ItemAdd(bb, id);
        window->DC.ItemFlags = backup_item_flags;
    }
    else
    {
        item_add = ItemAdd(bb, id);
    }

    if (span_all_columns)
    {
        window->ClipRect.Min.x = backup_clip_rect_min_x;
        window->ClipRect.Max.x = backup_clip_rect_max_x;
    }

    if (!item_add)
        return false;

    // FIXME: We can standardize the behavior of those two, we could also keep the fast path of override ClipRect + full push on render only,
    // which would be advantageous since most selectable are not selected.
    if (span_all_columns && window->DC.CurrentColumns)
        PushColumnsBackground();

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_Disabled)          { button_flags |= ImGuiButtonFlags_Disabled; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    if (flags & ImGuiSelectableFlags_Disabled)
        selected = false;

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            g.NavDisableHighlight = true;
            SetNavID(id, window->DC.NavLayerCurrent, window->DC.NavFocusScopeIdCurrent);
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }

    if (span_all_columns && window->DC.CurrentColumns)
        PopColumnsBackground();

    if (flags & ImGuiSelectableFlags_Disabled) PushStyleColor(ImGuiCol_Text, style.Colors[ImGuiCol_TextDisabled]);
    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb);
    if (flags & ImGuiSelectableFlags_Disabled) PopStyleColor();

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(window->DC.ItemFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return pressed;
}